

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall Model::Initialize(Model *this)

{
  pointer pPVar1;
  pointer pcVar2;
  Transcript *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *pmVar3;
  pointer psVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *pmVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  SpeciesTracker *pSVar8;
  element_type *peVar9;
  _Base_ptr p_Var10;
  Genome *pGVar11;
  iterator iVar12;
  pointer pPVar13;
  Model *pMVar14;
  double rate_constant;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
  promoter_name;
  Polymerase pol_template;
  Polymerase pol;
  double rate_constant_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rbs_names;
  undefined1 local_2d9;
  Genome *local_2d8;
  Genome *local_2d0;
  element_type *local_2c8;
  element_type *local_2c0;
  Gillespie *local_2b8;
  element_type *local_2b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  Model *local_2a0;
  double *local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
  local_290;
  pointer local_240;
  element_type *local_238;
  undefined1 local_230 [32];
  double local_210;
  char local_208 [32];
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  int iStack_1e0;
  _Alloc_hider local_1d8;
  char local_1c8 [16];
  bool local_1b8;
  undefined1 local_1b0 [24];
  key_type local_198;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  int iStack_160;
  _Alloc_hider local_158;
  size_type local_150;
  char local_148 [16];
  bool local_138;
  mapped_type local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  Ptr local_f8;
  Ptr local_e8;
  Ptr local_d8;
  Ptr local_c8;
  Ptr local_b8;
  Ptr local_a8;
  Ptr local_98;
  Ptr local_88;
  Ptr local_78;
  Ptr local_68;
  Ptr local_58;
  Ptr local_48;
  pointer local_38;
  
  psVar4 = (this->genomes_).
           super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_240 = (this->genomes_).
              super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if ((local_240 == psVar4) &&
     ((this->transcripts_).
      super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->transcripts_).
      super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Warning: There are no Genome objects registered with Model. Did you forget to register a Genome?"
               ,0x60);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    psVar4 = (this->genomes_).
             super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_240 = (this->genomes_).
                super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_2a0 = this;
  if (psVar4 != local_240) {
    local_2b8 = (Gillespie *)&this->cell_volume_;
    local_2c0 = (element_type *)&this->gillespie_;
    local_298 = (double *)&PTR__MobileElement_001a5620;
    do {
      local_2d0 = (psVar4->super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_2d8 = (Genome *)
                  (psVar4->super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      if (local_2d8 != (Genome *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8)->_M_use_count + 1;
        }
      }
      local_38 = psVar4;
      pmVar5 = Genome::bindings_abi_cxx11_(local_2d0);
      peVar9 = (element_type *)(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_2c8 = (element_type *)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
      if (peVar9 != local_2c8) {
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
          ::pair(&local_290,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                  *)&(peVar9->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header);
          pPVar1 = (local_2a0->polymerases_).
                   super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_238 = peVar9;
          for (pPVar13 = (local_2a0->polymerases_).
                         super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                         super__Vector_impl_data._M_start; pPVar13 != pPVar1; pPVar13 = pPVar13 + 1)
          {
            local_1b0._8_8_ = (element_type *)0x0;
            local_1b0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1b0._0_8_ = &PTR___cxa_pure_virtual_001a55f0;
            local_198._M_dataplus._M_p = local_1b0 + 0x28;
            pcVar2 = (pPVar13->super_MobileElement).name_._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_1b0 + 0x18),pcVar2,
                       pcVar2 + (pPVar13->super_MobileElement).name_._M_string_length);
            uStack_178._0_4_ = (pPVar13->super_MobileElement).start_;
            uStack_178._4_4_ = (pPVar13->super_MobileElement).stop_;
            uStack_170._0_4_ = (pPVar13->super_MobileElement).footprint_;
            uStack_170._4_4_ = *(undefined4 *)&(pPVar13->super_MobileElement).field_0x44;
            uStack_168 = *(undefined4 *)&(pPVar13->super_MobileElement).speed_;
            uStack_164 = *(undefined4 *)((long)&(pPVar13->super_MobileElement).speed_ + 4);
            iStack_160 = (pPVar13->super_MobileElement).reading_frame_;
            local_158._M_p = local_148;
            pcVar2 = (pPVar13->super_MobileElement).gene_bound_._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,pcVar2,
                       pcVar2 + (pPVar13->super_MobileElement).gene_bound_._M_string_length);
            local_138 = (pPVar13->super_MobileElement).polymerasereadthrough_;
            local_1b0._0_8_ = local_298;
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::find(&local_290.second._M_t,(key_type *)(local_1b0 + 0x18));
            if ((_Rb_tree_header *)cVar6._M_node !=
                &local_290.second._M_t._M_impl.super__Rb_tree_header) {
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::operator[](&local_290.second,(key_type *)(local_1b0 + 0x18));
              local_2b0 = (element_type *)*pmVar7;
              local_230._8_8_ = (element_type *)0x0;
              local_230._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_230._0_8_ = &PTR___cxa_pure_virtual_001a55f0;
              local_230._24_8_ = local_208;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_230 + 0x18),local_198._M_dataplus._M_p,
                         local_198._M_dataplus._M_p + local_198._M_string_length);
              uStack_1e8 = uStack_168;
              uStack_1e4 = uStack_164;
              iStack_1e0 = iStack_160;
              local_208._16_8_ = uStack_178;
              local_208._24_8_ = uStack_170;
              local_1d8._M_p = local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,local_158._M_p,local_158._M_p + local_150);
              local_1b8 = local_138;
              local_230._0_8_ = local_298;
              std::__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<BindPolymerase>,double&,double&,std::__cxx11::string_const&,Polymerase&>
                        ((__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2> *)&local_128,
                         (allocator<BindPolymerase> *)&local_130,(double *)&local_2b0,
                         (double *)local_2b8,&local_290.first,(Polymerase *)local_230);
              pSVar8 = SpeciesTracker::Instance();
              local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_128._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_128._M_impl.super__Rb_tree_header._M_header._M_color);
              local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_128._M_impl._0_8_;
              if (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              SpeciesTracker::Add(pSVar8,&local_290.first,&local_48);
              if (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_48.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_128._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_128._M_impl.super__Rb_tree_header._M_header._M_color);
              local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_128._M_impl._0_8_;
              if (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              SpeciesTracker::Add(pSVar8,(string *)(local_1b0 + 0x18),&local_58);
              if (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_58.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_128._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_128._M_impl.super__Rb_tree_header._M_header._M_color);
              local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_128._M_impl._0_8_;
              if (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              Gillespie::LinkReaction((Gillespie *)local_2c0,&local_68);
              if (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_68.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_128._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_128._M_impl.super__Rb_tree_header._M_header._M_color) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(local_128._M_impl.super__Rb_tree_header._M_header._4_4_,
                                    local_128._M_impl.super__Rb_tree_header._M_header._M_color));
              }
              MobileElement::~MobileElement((MobileElement *)local_230);
            }
            MobileElement::~MobileElement((MobileElement *)local_1b0);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::~_Rb_tree(&local_290.second._M_t);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.first._M_dataplus._M_p != &local_290.first.field_2) {
            operator_delete(local_290.first._M_dataplus._M_p);
          }
          peVar9 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_238);
        } while (peVar9 != local_2c8);
      }
      pGVar11 = local_2d0;
      if ((local_2d0->transcript_degradation_rate_ext_ != 0.0) ||
         (NAN(local_2d0->transcript_degradation_rate_ext_))) {
        Rnase::Rnase((Rnase *)local_1b0,local_2d0->rnase_footprint_,local_2d0->rnase_speed_);
        std::__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<BindRnase>,double_const&,double&,Rnase&,char_const(&)[17]>
                  ((__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2> *)&local_290,
                   (allocator<BindRnase> *)local_230,&pGVar11->transcript_degradation_rate_ext_,
                   (double *)local_2b8,(Rnase *)local_1b0,(char (*) [17])"__rnase_site_ext");
        pSVar8 = SpeciesTracker::Instance();
        local_230._0_8_ = local_230 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"__rnase_site_ext","");
        local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_290.first._M_dataplus._M_p;
        local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
          }
        }
        SpeciesTracker::Add(pSVar8,(string *)local_230,&local_78);
        if (local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
          operator_delete((void *)local_230._0_8_);
        }
        local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_290.first._M_dataplus._M_p;
        local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
          }
        }
        Gillespie::LinkReaction((Gillespie *)local_2c0,&local_88);
        if (local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_290.first._M_string_length);
        }
        MobileElement::~MobileElement((MobileElement *)local_1b0);
      }
      pGVar11 = local_2d0;
      if ((local_2d0->transcript_degradation_rate_ != 0.0) ||
         (NAN(local_2d0->transcript_degradation_rate_))) {
        Rnase::Rnase((Rnase *)local_1b0,local_2d0->rnase_footprint_,local_2d0->rnase_speed_);
        std::__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<BindRnase>,double_const&,double&,Rnase&,char_const(&)[13]>
                  ((__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2> *)&local_290,
                   (allocator<BindRnase> *)local_230,&pGVar11->transcript_degradation_rate_,
                   (double *)local_2b8,(Rnase *)local_1b0,(char (*) [13])"__rnase_site");
        pSVar8 = SpeciesTracker::Instance();
        local_230._0_8_ = local_230 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"__rnase_site","");
        local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_290.first._M_dataplus._M_p;
        local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
          }
        }
        SpeciesTracker::Add(pSVar8,(string *)local_230,&local_98);
        if (local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
          operator_delete((void *)local_230._0_8_);
        }
        local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_290.first._M_dataplus._M_p;
        local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                 *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
          }
        }
        Gillespie::LinkReaction((Gillespie *)local_2c0,&local_a8);
        if (local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_290.first._M_string_length);
        }
        MobileElement::~MobileElement((MobileElement *)local_1b0);
      }
      else if ((local_2d0->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pmVar3 = &local_2d0->rnase_bindings_;
        for (p_Var10 = (local_2d0->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var10 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          local_230._0_8_ = local_230 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_230,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          local_210 = *(double *)(p_Var10 + 2);
          Rnase::Rnase((Rnase *)local_1b0,local_2d0->rnase_footprint_,local_2d0->rnase_speed_);
          std::__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<BindRnase>,double&,double&,Rnase&,std::__cxx11::string_const&>
                    ((__shared_ptr<BindRnase,(__gnu_cxx::_Lock_policy)2> *)&local_290,
                     (allocator<BindRnase> *)&local_128,&local_210,(double *)local_2b8,
                     (Rnase *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
          ;
          pSVar8 = SpeciesTracker::Instance();
          local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_290.first._M_dataplus._M_p;
          local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                   *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                   *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
            }
          }
          SpeciesTracker::Add(pSVar8,(string *)local_230,&local_b8);
          if (local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_290.first._M_dataplus._M_p;
          local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                   *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_290.first._M_string_length + 8) =
                   *(_Atomic_word *)(local_290.first._M_string_length + 8) + 1;
            }
          }
          Gillespie::LinkReaction((Gillespie *)local_2c0,&local_c8);
          if (local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290.first._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_290.first._M_string_length);
          }
          MobileElement::~MobileElement((MobileElement *)local_1b0);
          if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
            operator_delete((void *)local_230._0_8_);
          }
        }
      }
      if (local_2d8 != (Genome *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8);
      }
      psVar4 = local_38 + 1;
    } while (psVar4 != local_240);
  }
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar11 = (Genome *)
            (local_2a0->transcripts_).
            super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2d8 = (Genome *)
              (local_2a0->transcripts_).
              super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pMVar14 = local_2a0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pGVar11 != local_2d8) {
    local_298 = &local_2a0->cell_volume_;
    local_2b8 = &local_2a0->gillespie_;
    do {
      this_00 = (Transcript *)(pGVar11->super_Polymer)._vptr_Polymer;
      local_2c8 = (pGVar11->super_Polymer).super_enable_shared_from_this<Polymer>._M_weak_this.
                  super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_2c8 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(local_2c8->super_enable_shared_from_this<Polymer>)._M_weak_this.
                   super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(local_2c8->super_enable_shared_from_this<Polymer>)._M_weak_this.
                        super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(local_2c8->super_enable_shared_from_this<Polymer>)._M_weak_this.
                   super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(local_2c8->super_enable_shared_from_this<Polymer>)._M_weak_this.
                        super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_2d0 = pGVar11;
      pmVar5 = Transcript::bindings_abi_cxx11_(this_00);
      peVar9 = (element_type *)(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_238 = (element_type *)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
      if (peVar9 != local_238) {
        do {
          local_2c0 = peVar9;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
          ::pair(&local_290,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                  *)&(peVar9->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header);
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_128,&local_290.first);
          if ((_Rb_tree_header *)iVar12._M_node == &local_128._M_impl.super__Rb_tree_header) {
            pPVar1 = (pMVar14->polymerases_).
                     super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pPVar13 = (pMVar14->polymerases_).
                           super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                           super__Vector_impl_data._M_start; pPVar13 != pPVar1;
                pPVar13 = pPVar13 + 1) {
              local_1b0._8_8_ = (element_type *)0x0;
              local_1b0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_1b0._0_8_ = &PTR___cxa_pure_virtual_001a55f0;
              local_198._M_dataplus._M_p = local_1b0 + 0x28;
              pcVar2 = (pPVar13->super_MobileElement).name_._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_1b0 + 0x18),pcVar2,
                         pcVar2 + (pPVar13->super_MobileElement).name_._M_string_length);
              uStack_178._0_4_ = (pPVar13->super_MobileElement).start_;
              uStack_178._4_4_ = (pPVar13->super_MobileElement).stop_;
              uStack_170._0_4_ = (pPVar13->super_MobileElement).footprint_;
              uStack_170._4_4_ = *(undefined4 *)&(pPVar13->super_MobileElement).field_0x44;
              uStack_168 = *(undefined4 *)&(pPVar13->super_MobileElement).speed_;
              uStack_164 = *(undefined4 *)((long)&(pPVar13->super_MobileElement).speed_ + 4);
              iStack_160 = (pPVar13->super_MobileElement).reading_frame_;
              local_158._M_p = local_148;
              pcVar2 = (pPVar13->super_MobileElement).gene_bound_._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,pcVar2,
                         pcVar2 + (pPVar13->super_MobileElement).gene_bound_._M_string_length);
              local_138 = (pPVar13->super_MobileElement).polymerasereadthrough_;
              local_1b0._0_8_ = &PTR__MobileElement_001a5620;
              cVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      ::find(&local_290.second._M_t,(key_type *)(local_1b0 + 0x18));
              if ((_Rb_tree_header *)cVar6._M_node !=
                  &local_290.second._M_t._M_impl.super__Rb_tree_header) {
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         ::operator[](&local_290.second,(key_type *)(local_1b0 + 0x18));
                local_130 = *pmVar7;
                local_230._8_8_ = (element_type *)0x0;
                local_230._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_230._0_8_ = &PTR___cxa_pure_virtual_001a55f0;
                local_230._24_8_ = local_208;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_230 + 0x18),local_198._M_dataplus._M_p,
                           local_198._M_dataplus._M_p + local_198._M_string_length);
                uStack_1e8 = uStack_168;
                uStack_1e4 = uStack_164;
                iStack_1e0 = iStack_160;
                local_208._16_8_ = uStack_178;
                local_208._24_8_ = uStack_170;
                local_1d8._M_p = local_1c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1d8,local_158._M_p,local_158._M_p + local_150);
                local_1b8 = local_138;
                local_230._0_8_ = &PTR__MobileElement_001a5620;
                std::__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<BindPolymerase>,double&,double&,std::__cxx11::string_const&,Polymerase&>
                          ((__shared_ptr<BindPolymerase,(__gnu_cxx::_Lock_policy)2> *)&local_2b0,
                           (allocator<BindPolymerase> *)&local_2d9,&local_130,local_298,
                           &local_290.first,(Polymerase *)local_230);
                pSVar8 = SpeciesTracker::Instance();
                local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2b0
                ;
                local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = local_2a8;
                if (local_2a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
                  }
                }
                SpeciesTracker::Add(pSVar8,&local_290.first,&local_d8);
                if (local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_d8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2b0
                ;
                local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = local_2a8;
                if (local_2a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
                  }
                }
                SpeciesTracker::Add(pSVar8,(string *)(local_1b0 + 0x18),&local_e8);
                if (local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_e8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2b0
                ;
                local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = local_2a8;
                if (local_2a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
                  }
                }
                Gillespie::LinkReaction(local_2b8,&local_f8);
                if (local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_f8.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_2a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a8);
                }
                MobileElement::~MobileElement((MobileElement *)local_230);
              }
              MobileElement::~MobileElement((MobileElement *)local_1b0);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_128,&local_290.first);
            pMVar14 = local_2a0;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::~_Rb_tree(&local_290.second._M_t);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.first._M_dataplus._M_p != &local_290.first.field_2) {
            operator_delete(local_290.first._M_dataplus._M_p);
          }
          peVar9 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_2c0);
        } while (peVar9 != local_238);
      }
      if (local_2c8 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8);
      }
      pGVar11 = (Genome *)
                &(local_2d0->super_Polymer).super_enable_shared_from_this<Polymer>._M_weak_this.
                 super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    } while (pGVar11 != local_2d8);
  }
  pMVar14->initialized_ = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_128);
  return;
}

Assistant:

void Model::Initialize() {
  if (genomes_.size() == 0 && transcripts_.size() == 0) {
    std::cerr << "Warning: There are no Genome objects registered with "
                 "Model. Did you forget to register a Genome?"
              << std::endl;
  }
  // Create Bind reactions for each promoter-polymerase pair
  for (Genome::Ptr genome : genomes_) {
    for (auto promoter_name : genome->bindings()) {
      for (auto pol : polymerases_) {
        if (promoter_name.second.count(pol.name()) != 0) {
          double rate_constant = promoter_name.second[pol.name()];
          Polymerase pol_template = Polymerase(pol);
          auto reaction = std::make_shared<BindPolymerase>(
              rate_constant, cell_volume_, promoter_name.first, pol_template);
          auto &tracker = SpeciesTracker::Instance();
          tracker.Add(promoter_name.first, reaction);
          tracker.Add(pol.name(), reaction);
          gillespie_.LinkReaction(reaction);
        }
      }
    }
    // Create reaction for external rnase binding
    if (genome->transcript_degradation_rate_ext() != 0.0) {
      auto rnase_template_ext =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction_ext = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate_ext(), cell_volume_,
          rnase_template_ext, "__rnase_site_ext");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site_ext", reaction_ext);
      gillespie_.LinkReaction(reaction_ext);
    }
    
    // Create reaction for internal rnase binding
    if (genome->transcript_degradation_rate() != 0.0) {
      // TODO: user defined Rnase speed
      // auto rnase_template = Rnase(10, 30);
      auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate(), cell_volume_, rnase_template,
          "__rnase_site");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site", reaction);
      gillespie_.LinkReaction(reaction);
    } 
    
    // Alternatively, create bind reactions for individual rnase sites
    else if (genome->rnase_bindings().size() != 0) {
      for (auto rnase_site : genome->rnase_bindings()) {
        auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
        auto reaction = std::make_shared<BindRnase>(
          rnase_site.second, cell_volume_, rnase_template, rnase_site.first);
        auto &tracker = SpeciesTracker::Instance();
        tracker.Add(rnase_site.first, reaction);
        gillespie_.LinkReaction(reaction);
      }
    }
  }
  
  // Initialize transcripts that have been defined independently of genome
  std::set <std::string> rbs_names;
  for (Transcript::Ptr transcript : transcripts_) {
    for (auto rbs_name : transcript->bindings()) {
      if (rbs_names.find(rbs_name.first) == rbs_names.end()) { // only make reactions for unique RBS sites
        for (auto pol : polymerases_) {
          if (rbs_name.second.count(pol.name()) != 0) {
            double rate_constant = rbs_name.second[pol.name()];
            Polymerase pol_template = Polymerase(pol);
            auto reaction = std::make_shared<BindPolymerase>(
                rate_constant, cell_volume_, rbs_name.first, pol_template);
            auto &tracker = SpeciesTracker::Instance();
            tracker.Add(rbs_name.first, reaction);
            tracker.Add(pol.name(), reaction);
            gillespie_.LinkReaction(reaction);
          }
        }
        rbs_names.insert(rbs_name.first);
      }
    }
  }

  initialized_ = true;
}